

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FASTCOVER_buildDictionary
                 (FASTCOVER_ctx_t *ctx,U32 *freqs,void *dictBuffer,size_t dictBufferCapacity,
                 ZDICT_cover_params_t parameters,U16 *segmentFreqs)

{
  ZDICT_cover_params_t parameters_00;
  COVER_epoch_info_t CVar1;
  clock_t cVar2;
  U32 *in_RCX;
  long in_RDX;
  long *in_RDI;
  undefined8 in_R8;
  COVER_segment_t CVar3;
  uint in_stack_0000000c;
  COVER_segment_t segment;
  size_t segmentSize;
  U32 epochEnd;
  U32 epochBegin;
  size_t epoch;
  size_t zeroScoreRun;
  size_t maxZeroScoreRun;
  COVER_epoch_info_t epochs;
  size_t tail;
  BYTE *dict;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  U32 *local_98;
  ulong local_88;
  U32 local_80;
  undefined4 in_stack_ffffffffffffff88;
  U32 in_stack_ffffffffffffff8c;
  U32 in_stack_ffffffffffffff90;
  U32 in_stack_ffffffffffffff94;
  U32 *in_stack_ffffffffffffff98;
  ulong local_58;
  ulong local_50;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  long lVar7;
  
  pUVar6 = in_RCX;
  lVar7 = in_RDX;
  CVar1 = COVER_computeEpochs((U32)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                              (U32)in_stack_ffffffffffffff48,
                              (U32)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                              (U32)in_stack_ffffffffffffff40);
  uVar4 = CVar1.num;
  uVar5 = CVar1.size;
  local_50 = 0;
  local_80 = in_stack_ffffffffffffff94;
  local_98 = in_stack_ffffffffffffff98;
  if (1 < g_displayLevel) {
    fprintf(_stderr,"Breaking content into %u epochs of size %u\n",(ulong)CVar1 & 0xffffffff,
            (ulong)uVar5);
    fflush(_stderr);
    local_80 = in_stack_ffffffffffffff94;
    local_98 = in_stack_ffffffffffffff98;
  }
  local_58 = 0;
  while (in_RCX != (U32 *)0x0) {
    parameters_00.d = uVar5;
    parameters_00.k = uVar4;
    parameters_00._8_8_ = in_RCX;
    parameters_00.splitPoint = (double)in_RDX;
    parameters_00.shrinkDict = (int)in_R8;
    parameters_00.shrinkDictMaxRegression = (int)((ulong)in_R8 >> 0x20);
    parameters_00.zParams._0_8_ = pUVar6;
    parameters_00._40_8_ = lVar7;
    CVar3 = FASTCOVER_selectSegment
                      ((FASTCOVER_ctx_t *)
                       CONCAT44((int)local_58 * uVar5,(int)local_58 * uVar5 + uVar5),local_98,
                       local_80,in_stack_ffffffffffffff90,parameters_00,
                       (U16 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_88 = CVar3._0_8_;
    in_stack_ffffffffffffff8c = CVar3.begin;
    in_stack_ffffffffffffff90 = CVar3.end;
    local_80 = CVar3.score;
    if (local_80 == 0) {
      local_50 = local_50 + 1;
      if (9 < local_50) break;
    }
    else {
      local_50 = 0;
      local_98 = in_RCX;
      if ((U32 *)(ulong)(((in_stack_ffffffffffffff90 - in_stack_ffffffffffffff8c) +
                         in_stack_0000000c) - 1) < in_RCX) {
        local_98 = (U32 *)(ulong)(((in_stack_ffffffffffffff90 - in_stack_ffffffffffffff8c) +
                                  in_stack_0000000c) - 1);
      }
      if (local_98 < (U32 *)(ulong)in_stack_0000000c) break;
      in_RCX = (U32 *)((long)in_RCX - (long)local_98);
      memcpy((void *)(in_RDX + (long)in_RCX),(void *)(*in_RDI + (local_88 & 0xffffffff)),
             (size_t)local_98);
      if ((1 < g_displayLevel) &&
         ((cVar2 = clock(), 150000 < cVar2 - g_time || (3 < g_displayLevel)))) {
        g_time = clock();
        fprintf(_stderr,"\r%u%%       ",
                (ulong)(((long)pUVar6 - (long)in_RCX) * 100) / (ulong)pUVar6 & 0xffffffff);
        fflush(_stderr);
      }
    }
    local_58 = (local_58 + 1) % (ulong)uVar4;
  }
  if (1 < g_displayLevel) {
    fprintf(_stderr,"\r%79s\r","");
    fflush(_stderr);
  }
  return (size_t)in_RCX;
}

Assistant:

static size_t
FASTCOVER_buildDictionary(const FASTCOVER_ctx_t* ctx,
                          U32* freqs,
                          void* dictBuffer, size_t dictBufferCapacity,
                          ZDICT_cover_params_t parameters,
                          U16* segmentFreqs)
{
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->nbDmers, parameters.k, 1);
  const size_t maxZeroScoreRun = 10;
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = FASTCOVER_selectSegment(
        ctx, freqs, epochBegin, epochEnd, parameters, segmentFreqs);

    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;

    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }

    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}